

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O1

size_t __thiscall
GrcManager::OutputCmap31Table
          (GrcManager *this,void *pCmapSubTblSrc,GrcBinaryStream *pbstrm,bool fFrom310,
          bool *pfNeed310)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  undefined7 in_register_00000009;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  short sVar12;
  ulong uVar13;
  uint8_t be [2];
  int cch;
  int key;
  vector<int,_std::allocator<int>_> vichGroupStart;
  utf16 rgchChars [65535];
  ushort uStack_200be;
  int iStack_200bc;
  uint uStack_200b8;
  int iStack_200b4;
  ulong uStack_200b0;
  void *pvStack_200a8;
  iterator iStack_200a0;
  int *piStack_20098;
  ulong uStack_20088;
  char *pcStack_20080;
  bool *pbStack_20078;
  undefined8 uStack_20070;
  long lStack_20068;
  undefined8 uStack_20060;
  string sStack_20058;
  ushort auStack_20038 [65540];
  
  pcVar11 = &(pbstrm->super_fstream).field_0x10;
  pbStack_20078 = pfNeed310;
  lStack_20068 = std::ostream::tellp();
  iStack_200bc = 0;
  std::ostream::write(pcVar11,(long)auStack_20038);
  uStack_20060 = std::ostream::tellp();
  std::ostream::write(pcVar11,(long)auStack_20038);
  std::ostream::write(pcVar11,(long)auStack_20038);
  uStack_20070 = std::ostream::tellp();
  std::ostream::write(pcVar11,(long)auStack_20038);
  std::ostream::write(pcVar11,(long)auStack_20038);
  std::ostream::write(pcVar11,(long)auStack_20038);
  std::ostream::write(pcVar11,(long)auStack_20038);
  pvStack_200a8 = (void *)0x0;
  iStack_200a0._M_current = (int *)0x0;
  piStack_20098 = (int *)0x0;
  iStack_200b4 = 0;
  if ((int)CONCAT71(in_register_00000009,fFrom310) == 0) {
    uVar5 = TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc,0,&iStack_200b4);
  }
  else {
    uVar5 = TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc,0,&iStack_200b4);
  }
  uStack_200b8 = 0;
  uVar10 = 0;
  if ((int)uVar5 < 0xffff) {
    uVar10 = 0;
    uStack_200b8 = 0;
    do {
      lVar6 = (long)iStack_200bc;
      auStack_20038[lVar6] = (ushort)uVar5;
      if ((lVar6 == 0) || (uVar5 != auStack_20038[lVar6 + -1] + 1)) {
        if (iStack_200a0._M_current == piStack_20098) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&pvStack_200a8,iStack_200a0,&iStack_200bc);
        }
        else {
          *iStack_200a0._M_current = iStack_200bc;
          iStack_200a0._M_current = iStack_200a0._M_current + 1;
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      iStack_200bc = iStack_200bc + 1;
      if (fFrom310) {
        uVar5 = TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc,uVar5,&iStack_200b4);
      }
      else {
        uVar5 = TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc,uVar5,&iStack_200b4);
      }
      iVar9 = (int)uVar10;
      if (0xfff4 < iStack_200bc * 2 + iVar9 * 8 + 0xe) {
        iStack_200bc = iStack_200bc + -1;
        if (*(int *)((long)pvStack_200a8 + (long)iVar9 * 4 + -4) == iStack_200bc) {
          uVar10 = (ulong)(iVar9 - 1);
          iStack_200a0._M_current = iStack_200a0._M_current + -1;
        }
        uStack_200b8 = (uint)CONCAT71((uint7)(uint3)((uint)iStack_200bc >> 8),1);
        uVar5 = 0xffff;
      }
    } while ((int)uVar5 < 0xffff);
  }
  auStack_20038[iStack_200bc] = 0xffff;
  if (iStack_200a0._M_current == piStack_20098) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pvStack_200a8,iStack_200a0,&iStack_200bc);
  }
  else {
    *iStack_200a0._M_current = iStack_200bc;
    iStack_200a0._M_current = iStack_200a0._M_current + 1;
  }
  iStack_200bc = iStack_200bc + 1;
  iVar9 = (int)uVar10;
  if (0 < iVar9) {
    uVar13 = 0;
    do {
      uStack_200be = auStack_20038[(long)*(int *)((long)pvStack_200a8 + uVar13 * 4 + 4) + -1] << 8 |
                     auStack_20038[(long)*(int *)((long)pvStack_200a8 + uVar13 * 4 + 4) + -1] >> 8;
      std::ostream::write(pcVar11,(long)&uStack_200be);
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  uStack_200be = 0xffff;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  uStack_200be = 0;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  uStack_20088 = uVar10;
  if (-1 < iVar9) {
    uVar13 = 0;
    do {
      uStack_200be = auStack_20038[*(int *)((long)pvStack_200a8 + uVar13 * 4)] << 8 |
                     auStack_20038[*(int *)((long)pvStack_200a8 + uVar13 * 4)] >> 8;
      std::ostream::write(pcVar11,(long)&uStack_200be);
      uVar13 = uVar13 + 1;
    } while (iVar9 + 1 != uVar13);
  }
  iVar9 = (int)uStack_20088;
  uVar13 = (ulong)(iVar9 + 1);
  uStack_200b0 = uVar13;
  if (-1 < iVar9) {
    do {
      uStack_200be = 0;
      std::ostream::write(pcVar11,(long)&uStack_200be);
      uVar5 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  if (iVar9 < 1) {
    uVar4 = 2;
  }
  else {
    uVar8 = 0;
    sVar12 = 0;
    uVar13 = uStack_200b0;
    pcStack_20080 = pcVar11;
    do {
      uVar4 = auStack_20038[*(int *)((long)pvStack_200a8 + uVar8 * 4)];
      uVar1 = auStack_20038[(long)*(int *)((long)pvStack_200a8 + uVar8 * 4 + 4) + -1];
      sVar2 = (short)uVar13 + sVar12;
      uStack_200be = sVar2 * 0x200 | (ushort)(sVar2 * 2) >> 8;
      std::ostream::write(pcStack_20080,(long)&uStack_200be);
      uVar8 = uVar8 + 1;
      sVar12 = (sVar12 - uVar4) + uVar1 + 1;
      uVar13 = (ulong)((int)uVar13 - 1);
    } while (uVar10 != uVar8);
    uVar4 = sVar12 * 2 + 2;
    iVar9 = (int)uStack_20088;
    pcVar11 = pcStack_20080;
  }
  uStack_200be = uVar4 << 8 | uVar4 >> 8;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  if (0 < iStack_200bc) {
    lVar6 = 0;
    do {
      if (auStack_20038[lVar6] == 0xffff) {
        uStack_200be = 0;
        std::ostream::write(pcVar11,(long)&uStack_200be);
      }
      else if (auStack_20038[lVar6] == 0x20) {
        uStack_200be = 0x200;
        std::ostream::write(pcVar11,(long)&uStack_200be);
      }
      else {
        uStack_200be = 0x300;
        std::ostream::write(pcVar11,(long)&uStack_200be);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iStack_200bc);
  }
  lVar6 = std::ostream::tellp();
  std::ostream::seekp(pcVar11,uStack_20060,0);
  sVar7 = lVar6 - lStack_20068;
  uVar4 = (ushort)sVar7;
  uStack_200be = uVar4 << 8 | uVar4 >> 8;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  uVar10 = uStack_200b0;
  uVar4 = 0;
  if ((int)uStack_200b0 == 0) {
    iVar9 = 0;
  }
  else if (iVar9 < 1) {
    iVar9 = 1;
  }
  else {
    uVar4 = 0;
    iVar3 = 2;
    do {
      iVar9 = iVar3;
      uVar4 = uVar4 + 1;
      iVar3 = iVar9 * 2;
    } while (iVar9 * 2 <= (int)uStack_200b0);
  }
  std::ostream::seekp(pcVar11,uStack_20070,0);
  sVar12 = (short)uVar10;
  uStack_200be = sVar12 << 9 | (ushort)(sVar12 * 2) >> 8;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  sVar2 = (short)iVar9;
  uStack_200be = sVar2 << 9 | (ushort)(sVar2 * 2) >> 8;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  uStack_200be = uVar4 << 8 | uVar4 >> 8;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  uStack_200be = (sVar12 - sVar2) * 0x200 | (ushort)((sVar12 - sVar2) * 2) >> 8;
  std::ostream::write(pcVar11,(long)&uStack_200be);
  std::ostream::seekp(pcVar11,lVar6,0);
  if ((uStack_200b8 & 1) != 0) {
    sStack_20058._M_dataplus._M_p = (pointer)&sStack_20058.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sStack_20058,
               "cmap format 4 subtable truncated--does not match format 12 subtable","");
    GrcErrorList::AddWarning(&g_errorList,0x157e,(GdlObject *)0x0,&sStack_20058);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_20058._M_dataplus._M_p != &sStack_20058.field_2) {
      operator_delete(sStack_20058._M_dataplus._M_p,sStack_20058.field_2._M_allocated_capacity + 1);
    }
  }
  *pbStack_20078 = (bool)((byte)uStack_200b8 & 1);
  if (pvStack_200a8 != (void *)0x0) {
    operator_delete(pvStack_200a8,(long)piStack_20098 - (long)pvStack_200a8);
  }
  return sVar7;
}

Assistant:

size_t GrcManager::OutputCmap31Table(void * pCmapSubTblSrc,
	GrcBinaryStream * pbstrm, bool fFrom310, bool * pfNeed310)
{
	auto lPosStart = pbstrm->Position();

	int cch = 0;	// number of codepoints in the map

	//	format
	pbstrm->WriteShort(4);

	//	length: fill in later
	auto lPosLen = pbstrm->Position();
	pbstrm->WriteShort(0);

	//	language (irrelevant except on Macintosh)
	pbstrm->WriteShort(0);

	//	search variables: fill in later
	auto lPosSearch = pbstrm->Position();
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);

	//	Generate the list of supported characters.

	utf16 rgchChars[65535];
	std::vector<int> vichGroupStart;
	//std::vector<int> vcchGroupSize;
	int cGroups = 0;
	bool fTruncated = false;
	int key = 0; // for optimizing next-codepoint lookup
	int ch = (fFrom310) ?
		TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc, 0, &key) :
		TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc, 0, &key);
	while (ch < 0xFFFF)
	{
		rgchChars[cch] = ch;
		if (cch == 0 || ch != rgchChars[cch - 1] + 1)
		{
			vichGroupStart.push_back(cch);
			cGroups++;
		}

		cch++;
		ch = (fFrom310) ?
			TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc, ch, &key) :
			TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc, ch, &key);

		// If we're over the limit of what the subtable can handle, truncate.
		int cbNeeded = 14	// header
			+ (cGroups * 8)	// group information
			+ (cch * 2)		// glyphIdArray
			+ 10;			// final FFFF
		if (cbNeeded >= 0xFFFF) // 65535 is limit on subtable length
		{
			if (vichGroupStart[cGroups - 1] == cch - 1)
			{
				vichGroupStart.pop_back();
				cGroups--;
			}
			cch--;
			ch = 0xFFFF;
			fTruncated = true;
		}
	}
	rgchChars[cch] = 0xFFFF;  // this must always be last
	vichGroupStart.push_back(cch);
	cGroups++;
	cch++;

	//	Output the ranges of characters.

	//	End codes
	int iGroup;
	for (iGroup = 0; iGroup < cGroups - 1; iGroup++)
		pbstrm->WriteShort(rgchChars[vichGroupStart[iGroup+1] - 1]);
	pbstrm->WriteShort(0xFFFF);

	//	reserved pad
	pbstrm->WriteShort(0);

	//	Start codes
	for (iGroup = 0; iGroup < cGroups; iGroup++)
		pbstrm->WriteShort(rgchChars[vichGroupStart[iGroup]]);

	//	id delta: not used; pad with zeros
	for (iGroup = 0; iGroup < cGroups; iGroup++)
		pbstrm->WriteShort(0);

	//	id range array: each element holds the offset (in bytes) from the element
	//	itself down to the corresponding glyphIdArray element (this works because
	//	glyphIdArray immediately follows idRangeArray).
	int cchSoFar = 0;
	for (iGroup = 0; iGroup < cGroups - 1; iGroup++)
	{
		int nStart = rgchChars[vichGroupStart[iGroup]];
		int nEnd = rgchChars[vichGroupStart[iGroup+1] - 1];

		int nRangeOffset = (cGroups - iGroup + cchSoFar) * 2; // *2 for bytes, not wchars
		pbstrm->WriteShort(nRangeOffset);

		cchSoFar += (nEnd - nStart + 1);
	}
	pbstrm->WriteShort((1 + cchSoFar) * 2);
	cchSoFar++;

	//	glyphIdArray: all characters point to our special square box,
	//	except for the space character.
	for (int ich = 0; ich < cch; ich++)
	{
		if (rgchChars[ich] == kchwSpace)
			pbstrm->WriteShort(2);
		else if (rgchChars[ich] == 0xFFFF) // invalid
			pbstrm->WriteShort(0);
		else
			pbstrm->WriteShort(3);
	}

	auto lPosEnd = pbstrm->Position();

	//	Fill in the length.
	size_t cb = size_t(lPosEnd - lPosStart);
	pbstrm->SetPosition(lPosLen);
	pbstrm->WriteShort(cb);

	//	Fill in the search variables; note that these are byte-based and so are multiplied by 2,
	//	unlike what is done in the Graphite tables.
	int nPowerOf2, nLog;
	BinarySearchConstants(cGroups, &nPowerOf2, &nLog);
	pbstrm->SetPosition(lPosSearch);
	pbstrm->WriteShort(cGroups << 1);	// * 2
	pbstrm->WriteShort(nPowerOf2 << 1); // * 2
	pbstrm->WriteShort(nLog);
	pbstrm->WriteShort((cGroups - nPowerOf2) << 1);  // * 2

	pbstrm->SetPosition(lPosEnd);

	if (fTruncated)
	{
		g_errorList.AddWarning(5502, NULL,
			"cmap format 4 subtable truncated--does not match format 12 subtable");
	}

	*pfNeed310 = fTruncated;

	return cb;
}